

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

void __thiscall icu_63::OlsonTimeZone::initTransitionRules(OlsonTimeZone *this,UErrorCode *status)

{
  UBool UVar1;
  int16_t iVar2;
  int32_t iVar3;
  int iVar4;
  InitialTimeZoneRule *this_00;
  TimeArrayTimeZoneRule **ppTVar5;
  undefined4 extraout_var;
  TimeZoneRule *pTVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TimeArrayTimeZoneRule *pTVar7;
  TimeZoneTransition *pTVar8;
  undefined4 extraout_var_02;
  UnicodeString *ID;
  bool bVar9;
  double time;
  TimeZoneTransition *local_300;
  TimeArrayTimeZoneRule *local_2e8;
  TimeZoneTransition *local_2a0;
  UnicodeString *local_298;
  TimeArrayTimeZoneRule *local_288;
  TimeArrayTimeZoneRule *local_260;
  InitialTimeZoneRule *local_250;
  TimeArrayTimeZoneRule *local_220;
  TimeZoneRule *prevRule;
  undefined1 local_208 [8];
  TimeZoneTransition tzt;
  TimeZoneRule *firstFinalRule;
  UDate startTime;
  TimeZoneTransition *local_1d0;
  undefined1 local_1c1;
  TimeArrayTimeZoneRule *local_1c0;
  int local_1b4;
  double dStack_1b0;
  int i;
  UDate tt;
  UDate *pUStack_1a0;
  int32_t nTimes;
  UDate *times;
  int16_t typeIdx;
  int16_t transitionIdx;
  int32_t transCount;
  InitialTimeZoneRule *local_188;
  int local_180;
  int local_17c;
  int32_t dst;
  int32_t raw;
  UnicodeString local_170;
  undefined1 local_130 [8];
  UnicodeString dstName;
  UnicodeString local_e8;
  undefined1 local_a8 [8];
  UnicodeString stdName;
  undefined1 local_58 [8];
  UnicodeString tzid;
  UErrorCode *status_local;
  OlsonTimeZone *this_local;
  
  tzid.fUnion._48_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  deleteTransitionRules(this);
  UnicodeString::UnicodeString((UnicodeString *)local_58);
  TimeZone::getID((TimeZone *)this,(UnicodeString *)local_58);
  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)((long)&dstName.fUnion + 0x30),L"(STD)");
  UnicodeString::UnicodeString(&local_e8,'\x01',(ConstChar16Ptr *)((long)&dstName.fUnion + 0x30),-1)
  ;
  operator+((UnicodeString *)local_a8,(UnicodeString *)local_58,&local_e8);
  UnicodeString::~UnicodeString(&local_e8);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)((long)&dstName.fUnion + 0x30));
  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&dst,L"(DST)");
  UnicodeString::UnicodeString(&local_170,'\x01',(ConstChar16Ptr *)&dst,-1);
  local_288 = (TimeArrayTimeZoneRule *)local_58;
  operator+((UnicodeString *)local_130,(UnicodeString *)local_288,&local_170);
  UnicodeString::~UnicodeString(&local_170);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&dst);
  iVar3 = initialRawOffset(this);
  local_17c = iVar3 * 1000;
  iVar3 = initialDstOffset(this);
  local_180 = iVar3 * 1000;
  this_00 = (InitialTimeZoneRule *)UMemory::operator_new((UMemory *)0x50,(size_t)local_288);
  transCount._3_1_ = 0;
  local_250 = (InitialTimeZoneRule *)0x0;
  if (this_00 != (InitialTimeZoneRule *)0x0) {
    transCount._3_1_ = 1;
    if (local_180 == 0) {
      local_260 = (TimeArrayTimeZoneRule *)local_a8;
    }
    else {
      local_260 = (TimeArrayTimeZoneRule *)local_130;
    }
    local_188 = this_00;
    InitialTimeZoneRule::InitialTimeZoneRule(this_00,(UnicodeString *)local_260,local_17c,local_180)
    ;
    local_288 = local_260;
    local_250 = this_00;
  }
  this->initialRule = local_250;
  if (this->initialRule == (InitialTimeZoneRule *)0x0) {
    *(undefined4 *)tzid.fUnion._48_8_ = 7;
    deleteTransitionRules(this);
    _typeIdx = 1;
    goto LAB_002271e7;
  }
  iVar2 = transitionCount(this);
  times._4_4_ = (int)iVar2;
  if (0 < times._4_4_) {
    this->firstTZTransitionIdx = 0;
    for (times._2_2_ = 0; (times._2_2_ < times._4_4_ && (this->typeMapData[times._2_2_] == '\0'));
        times._2_2_ = times._2_2_ + 1) {
      this->firstTZTransitionIdx = this->firstTZTransitionIdx + 1;
    }
    if (times._2_2_ != times._4_4_) {
      pUStack_1a0 = (UDate *)uprv_malloc_63((long)times._4_4_ << 3);
      if (pUStack_1a0 == (UDate *)0x0) {
        *(undefined4 *)tzid.fUnion._48_8_ = 7;
        deleteTransitionRules(this);
        _typeIdx = 1;
        goto LAB_002271e7;
      }
      for (times._0_2_ = 0; (short)(ushort)times < this->typeCount; times._0_2_ = (ushort)times + 1)
      {
        tt._4_4_ = 0;
        for (times._2_2_ = this->firstTZTransitionIdx; times._2_2_ < times._4_4_;
            times._2_2_ = times._2_2_ + 1) {
          if ((ushort)times == this->typeMapData[times._2_2_]) {
            local_288 = (TimeArrayTimeZoneRule *)(ulong)(uint)(int)times._2_2_;
            dStack_1b0 = transitionTime(this,times._2_2_);
            if ((this->finalZone == (SimpleTimeZone *)0x0) || (dStack_1b0 <= this->finalStartMillis)
               ) {
              pUStack_1a0[tt._4_4_] = dStack_1b0;
              tt._4_4_ = tt._4_4_ + 1;
            }
          }
        }
        if (0 < tt._4_4_) {
          local_17c = this->typeOffsets[(int)(short)(ushort)times << 1] * 1000;
          local_180 = this->typeOffsets[(short)(ushort)times * 2 + 1] * 1000;
          if (this->historicRules == (TimeArrayTimeZoneRule **)0x0) {
            this->historicRuleCount = this->typeCount;
            ppTVar5 = (TimeArrayTimeZoneRule **)uprv_malloc_63((long)this->historicRuleCount << 3);
            this->historicRules = ppTVar5;
            if (this->historicRules == (TimeArrayTimeZoneRule **)0x0) {
              *(undefined4 *)tzid.fUnion._48_8_ = 7;
              deleteTransitionRules(this);
              uprv_free_63(pUStack_1a0);
              _typeIdx = 1;
              goto LAB_002271e7;
            }
            for (local_1b4 = 0; local_1b4 < this->historicRuleCount; local_1b4 = local_1b4 + 1) {
              this->historicRules[local_1b4] = (TimeArrayTimeZoneRule *)0x0;
            }
          }
          pTVar7 = (TimeArrayTimeZoneRule *)
                   UMemory::operator_new((UMemory *)0x160,(size_t)local_288);
          local_1c1 = 0;
          local_288 = (TimeArrayTimeZoneRule *)0x0;
          if (pTVar7 != (TimeArrayTimeZoneRule *)0x0) {
            local_1c1 = 1;
            if (local_180 == 0) {
              local_298 = (UnicodeString *)local_a8;
            }
            else {
              local_298 = (UnicodeString *)local_130;
            }
            local_1c0 = pTVar7;
            TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
                      (pTVar7,local_298,local_17c,local_180,pUStack_1a0,tt._4_4_,UTC_TIME);
            local_288 = pTVar7;
          }
          this->historicRules[(short)(ushort)times] = local_288;
          if (this->historicRules[(short)(ushort)times] == (TimeArrayTimeZoneRule *)0x0) {
            *(undefined4 *)tzid.fUnion._48_8_ = 7;
            deleteTransitionRules(this);
            _typeIdx = 1;
            goto LAB_002271e7;
          }
        }
      }
      uprv_free_63(pUStack_1a0);
      times._0_2_ = (ushort)this->typeMapData[this->firstTZTransitionIdx];
      pTVar8 = (TimeZoneTransition *)UMemory::operator_new((UMemory *)0x20,(size_t)local_288);
      startTime._7_1_ = 0;
      local_2a0 = (TimeZoneTransition *)0x0;
      if (pTVar8 != (TimeZoneTransition *)0x0) {
        startTime._7_1_ = 1;
        local_1d0 = pTVar8;
        time = transitionTime(this,this->firstTZTransitionIdx);
        TimeZoneTransition::TimeZoneTransition
                  (pTVar8,time,&this->initialRule->super_TimeZoneRule,
                   &this->historicRules[(short)(ushort)times]->super_TimeZoneRule);
        local_2a0 = pTVar8;
      }
      this->firstTZTransition = local_2a0;
      if (this->firstTZTransition == (TimeZoneTransition *)0x0) {
        *(undefined4 *)tzid.fUnion._48_8_ = 7;
        deleteTransitionRules(this);
        _typeIdx = 1;
        goto LAB_002271e7;
      }
    }
  }
  if (this->finalZone != (SimpleTimeZone *)0x0) {
    firstFinalRule = (TimeZoneRule *)this->finalStartMillis;
    tzt.fTo = (TimeZoneRule *)0x0;
    iVar4 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9])
                      ();
    if ((char)iVar4 == '\0') {
      iVar4 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                [0xc])();
      this->finalZoneWithStartYear = (SimpleTimeZone *)CONCAT44(extraout_var_01,iVar4);
      if (this->finalZoneWithStartYear == (SimpleTimeZone *)0x0) {
        *(undefined4 *)tzid.fUnion._48_8_ = 7;
        deleteTransitionRules(this);
        _typeIdx = 1;
        goto LAB_002271e7;
      }
      ID = (UnicodeString *)local_58;
      TimeZone::getID((TimeZone *)this->finalZone,ID);
      pTVar7 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)ID);
      local_2e8 = (TimeArrayTimeZoneRule *)0x0;
      if (pTVar7 != (TimeArrayTimeZoneRule *)0x0) {
        iVar4 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                  [8])();
        ID = (UnicodeString *)local_58;
        TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
                  (pTVar7,ID,iVar4,0,(UDate *)&firstFinalRule,1,UTC_TIME);
        local_2e8 = pTVar7;
      }
      tzt.fTo = &local_2e8->super_TimeZoneRule;
      if (local_2e8 == (TimeArrayTimeZoneRule *)0x0) {
        *(undefined4 *)tzid.fUnion._48_8_ = 7;
        deleteTransitionRules(this);
        _typeIdx = 1;
        goto LAB_002271e7;
      }
    }
    else {
      iVar4 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                [0xc])();
      this->finalZoneWithStartYear = (SimpleTimeZone *)CONCAT44(extraout_var,iVar4);
      if (this->finalZoneWithStartYear == (SimpleTimeZone *)0x0) {
        *(undefined4 *)tzid.fUnion._48_8_ = 7;
        deleteTransitionRules(this);
        _typeIdx = 1;
        goto LAB_002271e7;
      }
      SimpleTimeZone::setStartYear(this->finalZoneWithStartYear,this->finalStartYear);
      TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)local_208);
      ID = (UnicodeString *)0x0;
      (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject.
        _vptr_UObject[0xe])(firstFinalRule,this->finalZoneWithStartYear,0,local_208);
      pTVar6 = TimeZoneTransition::getTo((TimeZoneTransition *)local_208);
      iVar4 = (*(pTVar6->super_UObject)._vptr_UObject[3])();
      tzt.fTo = (TimeZoneRule *)CONCAT44(extraout_var_00,iVar4);
      bVar9 = tzt.fTo != (TimeZoneRule *)0x0;
      if (bVar9) {
        firstFinalRule =
             (TimeZoneRule *)TimeZoneTransition::getTime((TimeZoneTransition *)local_208);
      }
      else {
        *(undefined4 *)tzid.fUnion._48_8_ = 7;
        deleteTransitionRules(this);
      }
      _typeIdx = (uint)!bVar9;
      TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)local_208);
      if (_typeIdx != 0) goto LAB_002271e7;
    }
    local_220 = (TimeArrayTimeZoneRule *)0x0;
    if (0 < times._4_4_) {
      local_220 = this->historicRules[this->typeMapData[times._4_4_ + -1]];
    }
    if (local_220 == (TimeArrayTimeZoneRule *)0x0) {
      local_220 = (TimeArrayTimeZoneRule *)this->initialRule;
    }
    pTVar8 = (TimeZoneTransition *)UMemory::operator_new((UMemory *)0x20,(size_t)ID);
    local_300 = (TimeZoneTransition *)0x0;
    if (pTVar8 != (TimeZoneTransition *)0x0) {
      TimeZoneTransition::TimeZoneTransition(pTVar8);
      local_300 = pTVar8;
    }
    this->firstFinalTZTransition = local_300;
    if (this->firstFinalTZTransition == (TimeZoneTransition *)0x0) {
      *(undefined4 *)tzid.fUnion._48_8_ = 7;
      deleteTransitionRules(this);
      _typeIdx = 1;
      goto LAB_002271e7;
    }
    TimeZoneTransition::setTime(this->firstFinalTZTransition,(UDate)firstFinalRule);
    pTVar8 = this->firstFinalTZTransition;
    iVar4 = (*(local_220->super_TimeZoneRule).super_UObject._vptr_UObject[3])();
    TimeZoneTransition::adoptFrom(pTVar8,(TimeZoneRule *)CONCAT44(extraout_var_02,iVar4));
    TimeZoneTransition::adoptTo(this->firstFinalTZTransition,tzt.fTo);
  }
  _typeIdx = 0;
LAB_002271e7:
  UnicodeString::~UnicodeString((UnicodeString *)local_130);
  UnicodeString::~UnicodeString((UnicodeString *)local_a8);
  UnicodeString::~UnicodeString((UnicodeString *)local_58);
  return;
}

Assistant:

void
OlsonTimeZone::initTransitionRules(UErrorCode& status) {
    if(U_FAILURE(status)) {
        return;
    }
    deleteTransitionRules();
    UnicodeString tzid;
    getID(tzid);

    UnicodeString stdName = tzid + UNICODE_STRING_SIMPLE("(STD)");
    UnicodeString dstName = tzid + UNICODE_STRING_SIMPLE("(DST)");

    int32_t raw, dst;

    // Create initial rule
    raw = initialRawOffset() * U_MILLIS_PER_SECOND;
    dst = initialDstOffset() * U_MILLIS_PER_SECOND;
    initialRule = new InitialTimeZoneRule((dst == 0 ? stdName : dstName), raw, dst);
    // Check to make sure initialRule was created
    if (initialRule == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        deleteTransitionRules();
        return;
    }

    int32_t transCount = transitionCount();
    if (transCount > 0) {
        int16_t transitionIdx, typeIdx;

        // We probably no longer need to check the first "real" transition
        // here, because the new tzcode remove such transitions already.
        // For now, keeping this code for just in case. Feb 19, 2010 Yoshito
        firstTZTransitionIdx = 0;
        for (transitionIdx = 0; transitionIdx < transCount; transitionIdx++) {
            if (typeMapData[transitionIdx] != 0) { // type 0 is the initial type
                break;
            }
            firstTZTransitionIdx++;
        }
        if (transitionIdx == transCount) {
            // Actually no transitions...
        } else {
            // Build historic rule array
            UDate* times = (UDate*)uprv_malloc(sizeof(UDate)*transCount); /* large enough to store all transition times */
            if (times == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                deleteTransitionRules();
                return;
            }
            for (typeIdx = 0; typeIdx < typeCount; typeIdx++) {
                // Gather all start times for each pair of offsets
                int32_t nTimes = 0;
                for (transitionIdx = firstTZTransitionIdx; transitionIdx < transCount; transitionIdx++) {
                    if (typeIdx == (int16_t)typeMapData[transitionIdx]) {
                        UDate tt = (UDate)transitionTime(transitionIdx);
                        if (finalZone == NULL || tt <= finalStartMillis) {
                            // Exclude transitions after finalMillis
                            times[nTimes++] = tt;
                        }
                    }
                }
                if (nTimes > 0) {
                    // Create a TimeArrayTimeZoneRule
                    raw = typeOffsets[typeIdx << 1] * U_MILLIS_PER_SECOND;
                    dst = typeOffsets[(typeIdx << 1) + 1] * U_MILLIS_PER_SECOND;
                    if (historicRules == NULL) {
                        historicRuleCount = typeCount;
                        historicRules = (TimeArrayTimeZoneRule**)uprv_malloc(sizeof(TimeArrayTimeZoneRule*)*historicRuleCount);
                        if (historicRules == NULL) {
                            status = U_MEMORY_ALLOCATION_ERROR;
                            deleteTransitionRules();
                            uprv_free(times);
                            return;
                        }
                        for (int i = 0; i < historicRuleCount; i++) {
                            // Initialize TimeArrayTimeZoneRule pointers as NULL
                            historicRules[i] = NULL;
                        }
                    }
                    historicRules[typeIdx] = new TimeArrayTimeZoneRule((dst == 0 ? stdName : dstName),
                        raw, dst, times, nTimes, DateTimeRule::UTC_TIME);
                    // Check for memory allocation error
                    if (historicRules[typeIdx] == NULL) {
                        status = U_MEMORY_ALLOCATION_ERROR;
                        deleteTransitionRules();
                        return;
                    }
                }
            }
            uprv_free(times);

            // Create initial transition
            typeIdx = (int16_t)typeMapData[firstTZTransitionIdx];
            firstTZTransition = new TimeZoneTransition((UDate)transitionTime(firstTZTransitionIdx),
                    *initialRule, *historicRules[typeIdx]);
            // Check to make sure firstTZTransition was created.
            if (firstTZTransition == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                deleteTransitionRules();
                return;
            }
        }
    }
    if (finalZone != NULL) {
        // Get the first occurence of final rule starts
        UDate startTime = (UDate)finalStartMillis;
        TimeZoneRule *firstFinalRule = NULL;

        if (finalZone->useDaylightTime()) {
            /*
             * Note: When an OlsonTimeZone is constructed, we should set the final year
             * as the start year of finalZone.  However, the bounday condition used for
             * getting offset from finalZone has some problems.
             * For now, we do not set the valid start year when the construction time
             * and create a clone and set the start year when extracting rules.
             */
            finalZoneWithStartYear = (SimpleTimeZone*)finalZone->clone();
            // Check to make sure finalZone was actually cloned.
            if (finalZoneWithStartYear == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                deleteTransitionRules();
                return;
            }
            finalZoneWithStartYear->setStartYear(finalStartYear);

            TimeZoneTransition tzt;
            finalZoneWithStartYear->getNextTransition(startTime, false, tzt);
            firstFinalRule  = tzt.getTo()->clone();
            // Check to make sure firstFinalRule received proper clone.
            if (firstFinalRule == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                deleteTransitionRules();
                return;
            }
            startTime = tzt.getTime();
        } else {
            // final rule with no transitions
            finalZoneWithStartYear = (SimpleTimeZone*)finalZone->clone();
            // Check to make sure finalZone was actually cloned.
            if (finalZoneWithStartYear == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                deleteTransitionRules();
                return;
            }
            finalZone->getID(tzid);
            firstFinalRule = new TimeArrayTimeZoneRule(tzid,
                finalZone->getRawOffset(), 0, &startTime, 1, DateTimeRule::UTC_TIME);
            // Check firstFinalRule was properly created.
            if (firstFinalRule == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                deleteTransitionRules();
                return;
            }
        }
        TimeZoneRule *prevRule = NULL;
        if (transCount > 0) {
            prevRule = historicRules[typeMapData[transCount - 1]];
        }
        if (prevRule == NULL) {
            // No historic transitions, but only finalZone available
            prevRule = initialRule;
        }
        firstFinalTZTransition = new TimeZoneTransition();
        // Check to make sure firstFinalTZTransition was created before dereferencing
        if (firstFinalTZTransition == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            deleteTransitionRules();
            return;
        }
        firstFinalTZTransition->setTime(startTime);
        firstFinalTZTransition->adoptFrom(prevRule->clone());
        firstFinalTZTransition->adoptTo(firstFinalRule);
    }
}